

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O1

SPIRExpression * __thiscall
spirv_cross::Compiler::set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int_const&,bool>
          (Compiler *this,uint32_t id,char (*args) [1],uint *args_1,bool *args_2)

{
  Variant *this_00;
  SPIRExpression *val;
  
  ParsedIR::add_typed_id(&this->ir,TypeExpression,(ID)id);
  this_00 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id;
  val = ObjectPool<spirv_cross::SPIRExpression>::allocate<char_const(&)[1],unsigned_int_const&,bool>
                  ((ObjectPool<spirv_cross::SPIRExpression> *)
                   this_00->group->pools[8]._M_t.
                   super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                   .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl,args,
                   args_1,args_2);
  Variant::set(this_00,&val->super_IVariant,TypeExpression);
  (val->super_IVariant).self.id = id;
  val->emitted_loop_level = this->current_loop_level;
  return val;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}